

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O3

UChar * u_strrchr_63(UChar *s,UChar c)

{
  UChar UVar1;
  UChar *result;
  UChar *pUVar2;
  UChar local_2;
  
  if ((c & 0xf800U) == 0xd800) {
    pUVar2 = u_strFindLast_63(s,-1,&local_2,1);
  }
  else {
    pUVar2 = (UChar *)0x0;
    do {
      UVar1 = *s;
      if (UVar1 == c) {
        pUVar2 = s;
      }
      s = s + 1;
    } while (UVar1 != L'\0');
  }
  return pUVar2;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strrchr(const UChar *s, UChar c) {
    if(U16_IS_SURROGATE(c)) {
        /* make sure to not find half of a surrogate pair */
        return u_strFindLast(s, -1, &c, 1);
    } else {
        const UChar *result=NULL;
        UChar cs;

        /* trivial search for a BMP code point */
        for(;;) {
            if((cs=*s)==c) {
                result=s;
            }
            if(cs==0) {
                return (UChar *)result;
            }
            ++s;
        }
    }
}